

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRgba.cpp
# Opt level: O2

void testRgba(string *tempDir)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  _Alloc_hider _Var5;
  _func_int **pp_Var6;
  Rgba *pRVar7;
  byte bVar8;
  char cVar9;
  bool ytc;
  bool ytc_00;
  bool ytc_01;
  bool ytc_02;
  int iVar10;
  ostream *poVar11;
  long lVar12;
  Compression *pCVar13;
  Box2i *pBVar14;
  ChannelList *pCVar15;
  half *phVar16;
  half *phVar17;
  long lVar18;
  ulong uVar19;
  int x;
  RgbaChannels channels;
  long lVar20;
  char *pcVar21;
  ulong uVar22;
  half *phVar23;
  undefined8 in_R9;
  ulong uVar24;
  undefined1 xtc;
  undefined8 in_R10;
  int y;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  double dVar28;
  double dVar29;
  Compression in_stack_fffffffffffffe68;
  half local_18a;
  string fileName;
  RgbaOutputFile out;
  Header header;
  Array2D<Imf_2_5::Rgba> p1_1;
  half local_c2;
  half local_c0;
  half local_be;
  half local_bc;
  half local_ba;
  half local_b8;
  half local_b6;
  half local_b4;
  half local_b2;
  string *local_b0;
  ulong local_a8;
  double local_a0;
  Array2D<half> p2_2;
  Array2D<half> p1_2;
  ulong local_68;
  long local_58;
  Array2D<Imf_2_5::Rgba> p1;
  
  local_b0 = tempDir;
  poVar11 = std::operator<<((ostream *)&std::cout,"Testing the RGBA image interface");
  std::endl<char,std::char_traits<char>>(poVar11);
  half::half((half *)&header,2.0);
  half::half((half *)&fileName,3.0);
  half::half((half *)&p1_1,4.0);
  half::half((half *)&out,1.0);
  uVar22 = (ulong)(ushort)header._map._M_t._M_impl._0_2_;
  fVar2 = *(float *)((long)&half::_toFloat + uVar22 * 4);
  if ((fVar2 == 2.0) && (!NAN(fVar2))) {
    uVar26 = (ulong)fileName._M_dataplus._M_p & 0xffff;
    fVar2 = *(float *)((long)&half::_toFloat + uVar26 * 4);
    if ((fVar2 == 3.0) && (!NAN(fVar2))) {
      fVar2 = *(float *)((long)&half::_toFloat + (p1_1._sizeX & 0xffffU) * 4);
      if ((fVar2 == 4.0) && (!NAN(fVar2))) {
        uVar24 = (ulong)out._vptr_RgbaOutputFile & 0xffff;
        fVar2 = *(float *)((long)&half::_toFloat + uVar24 * 4);
        if ((fVar2 == 1.0) && (!NAN(fVar2))) {
          half::half((half *)&p1_2,5.0);
          half::half((half *)&p2_2,6.0);
          half::half((half *)&p1,7.0);
          fVar2 = *(float *)((long)&half::_toFloat + (p1_2._sizeX & 0xffffU) * 4);
          if (((((fVar2 != 5.0) || (NAN(fVar2))) ||
               (fVar2 = *(float *)((long)&half::_toFloat + (p2_2._sizeX & 0xffffU) * 4),
               fVar2 != 6.0)) ||
              ((NAN(fVar2) ||
               (fVar2 = *(float *)((long)&half::_toFloat + (p1._sizeX & 0xffffU) * 4), fVar2 != 7.0)
               ))) || ((NAN(fVar2) ||
                       (((float)half::_toFloat != 0.0 || (NAN((float)half::_toFloat))))))) {
            pcVar21 = "y.r == 5.f && y.g == 6.f && y.b == 7.f && y.a == 0.f";
            uVar25 = 0x4a;
          }
          else {
            fVar2 = *(float *)((long)&half::_toFloat + uVar22 * 4);
            if ((((fVar2 == 2.0) && (!NAN(fVar2))) &&
                (fVar2 = *(float *)((long)&half::_toFloat + uVar26 * 4), fVar2 == 3.0)) &&
               (((!NAN(fVar2) &&
                 (fVar2 = *(float *)((long)&half::_toFloat + (p1_1._sizeX & 0xffffU) * 4),
                 fVar2 == 4.0)) &&
                ((!NAN(fVar2) &&
                 ((fVar2 = *(float *)((long)&half::_toFloat + uVar24 * 4), fVar2 == 1.0 &&
                  (!NAN(fVar2))))))))) {
              p1._sizeX = 0x77;
              p1._sizeY = 0xed;
              p1._data = (Rgba *)operator_new__(0x37158);
              local_a8 = 0;
              for (lVar12 = 0; lVar12 != 0x77; lVar12 = lVar12 + 1) {
                dVar28 = (double)(int)lVar12;
                lVar18 = 0;
                for (lVar20 = 0; pRVar7 = p1._data, lVar20 != 0xed; lVar20 = lVar20 + 1) {
                  lVar27 = p1._sizeY * local_a8;
                  local_a0 = (double)(int)lVar20;
                  phVar23 = (half *)((long)&((p1._data)->r)._h + lVar27 + lVar18);
                  dVar29 = sin(local_a0 * 0.1 + dVar28 * 0.1);
                  half::operator=(phVar23,(float)(dVar29 * 0.5 + 0.5));
                  dVar29 = sin(local_a0 * 0.1 + dVar28 * 0.2);
                  phVar17 = (half *)((long)&(pRVar7->g)._h + lVar18 + lVar27);
                  half::operator=(phVar17,(float)(dVar29 * 0.5 + 0.5));
                  dVar29 = sin(local_a0 * 0.1 + dVar28 * 0.3);
                  phVar16 = (half *)((long)&(pRVar7->b)._h + lVar18 + lVar27);
                  half::operator=(phVar16,(float)(dVar29 * 0.5 + 0.5));
                  half::operator=((half *)((long)&(pRVar7->a)._h + lVar18 + lVar27),
                                  (*(float *)((long)&half::_toFloat + (ulong)phVar23->_h * 4) +
                                   *(float *)((long)&half::_toFloat + (ulong)phVar16->_h * 4) +
                                  *(float *)((long)&half::_toFloat + (ulong)phVar17->_h * 4)) / 3.0)
                  ;
                  lVar18 = lVar18 + 8;
                }
                local_a8 = local_a8 + 8;
              }
              bVar8 = IlmThread_2_5::supportsThreads();
              if ((uint)bVar8 + (uint)bVar8 * 2 != -1) {
                cVar9 = IlmThread_2_5::supportsThreads();
                if (cVar9 != '\0') {
                  Imf_2_5::setGlobalThreadCount(0);
                  poVar11 = std::operator<<((ostream *)&std::cout,"\nnumber of threads: ");
                  iVar10 = Imf_2_5::globalThreadCount();
                  poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar10);
                  std::endl<char,std::char_traits<char>>(poVar11);
                }
                for (uVar25 = 0; uVar25 != 2; uVar25 = uVar25 + 1) {
                  for (channels = 0; channels != (WRITE_A|WRITE_G); channels = channels + WRITE_R) {
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&header,local_b0,"imf_test_rgba.exr");
                    iVar10 = (int)&p1;
                    anon_unknown.dwarf_21cf26::writeReadRGBA
                              ((char *)CONCAT62(header._map._M_t._M_impl._2_6_,
                                                header._map._M_t._M_impl._0_2_),iVar10,0xf,
                               (Array2D<Imf_2_5::Rgba> *)(ulong)uVar25,channels,(LineOrder)in_R9,
                               in_stack_fffffffffffffe68);
                    std::__cxx11::string::~string((string *)&header);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&header,local_b0,"imf_test_rgba.exr");
                    anon_unknown.dwarf_21cf26::writeReadRGBA
                              ((char *)CONCAT62(header._map._M_t._M_impl._2_6_,
                                                header._map._M_t._M_impl._0_2_),iVar10,7,
                               (Array2D<Imf_2_5::Rgba> *)(ulong)uVar25,channels,(LineOrder)in_R9,
                               in_stack_fffffffffffffe68);
                    std::__cxx11::string::~string((string *)&header);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&header,local_b0,"imf_test_rgba.exr");
                    anon_unknown.dwarf_21cf26::writeReadRGBA
                              ((char *)CONCAT62(header._map._M_t._M_impl._2_6_,
                                                header._map._M_t._M_impl._0_2_),iVar10,8,
                               (Array2D<Imf_2_5::Rgba> *)(ulong)uVar25,channels,(LineOrder)in_R9,
                               in_stack_fffffffffffffe68);
                    std::__cxx11::string::~string((string *)&header);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&header,local_b0,"imf_test_rgba.exr");
                    anon_unknown.dwarf_21cf26::writeReadRGBA
                              ((char *)CONCAT62(header._map._M_t._M_impl._2_6_,
                                                header._map._M_t._M_impl._0_2_),iVar10,5,
                               (Array2D<Imf_2_5::Rgba> *)(ulong)uVar25,channels,(LineOrder)in_R9,
                               in_stack_fffffffffffffe68);
                    std::__cxx11::string::~string((string *)&header);
                  }
                }
                poVar11 = std::operator<<((ostream *)&std::cout,
                                          "\nfile with missing and broken scan lines");
                std::endl<char,std::char_traits<char>>(poVar11);
                std::operator+(&fileName,local_b0,"imf_test_incomplete.exr");
                p1_1._sizeX = 300;
                p1_1._sizeY = 400;
                p1_1._data = (Rgba *)operator_new__(960000);
                local_58 = 0;
                for (local_68 = 0; local_68 != 300; local_68 = local_68 + 1) {
                  uVar25 = 0;
                  local_a0 = (double)CONCAT44(local_a0._4_4_,
                                              (float)(int)((local_68 & 0xffffffff) % 0x17));
                  local_a8 = CONCAT44(local_a8._4_4_,(float)(int)((local_68 & 0xffffffff) % 0x1d));
                  lVar12 = 0;
                  while( true ) {
                    if (lVar12 == 0xc80) break;
                    half::half((half *)&p1_2,(float)(int)(short)((uVar25 & 0xffff) % 5));
                    half::half((half *)&p2_2,(float)(int)(short)((uVar25 & 0xffff) % 0x11));
                    half::half(&local_18a,local_a0._0_4_);
                    half::half(&local_b2,(float)local_a8);
                    *(ulong *)((long)&((p1_1._data)->r)._h + lVar12 + p1_1._sizeY * local_58) =
                         CONCAT26(local_b2._h,
                                  CONCAT24(local_18a._h,
                                           CONCAT22((undefined2)p2_2._sizeX,(undefined2)p1_2._sizeX)
                                          ));
                    lVar12 = lVar12 + 8;
                    uVar25 = uVar25 + 1;
                  }
                  local_58 = local_58 + 8;
                }
                poVar11 = std::operator<<((ostream *)&std::cout,"writing");
                std::endl<char,std::char_traits<char>>(poVar11);
                remove(fileName._M_dataplus._M_p);
                out._vptr_RgbaOutputFile = (_func_int **)0x0;
                Imf_2_5::Header::Header
                          (&header,400,300,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
                pCVar13 = Imf_2_5::Header::compression(&header);
                _Var5 = fileName._M_dataplus;
                *pCVar13 = ZIPS_COMPRESSION;
                iVar10 = Imf_2_5::globalThreadCount();
                Imf_2_5::RgbaOutputFile::RgbaOutputFile(&out,_Var5._M_p,&header,WRITE_RGBA,iVar10);
                Imf_2_5::RgbaOutputFile::setFrameBuffer(&out,p1_1._data,1,400);
                Imf_2_5::RgbaOutputFile::writePixels(&out,0x96);
                Imf_2_5::RgbaOutputFile::breakScanLine(&out,10,10,10,-1);
                Imf_2_5::RgbaOutputFile::breakScanLine(&out,0x19,10,10,-1);
                Imf_2_5::RgbaOutputFile::~RgbaOutputFile(&out);
                Imf_2_5::Header::~Header(&header);
                out._vptr_RgbaOutputFile = (_func_int **)0x12c;
                out._outputFile = (OutputFile *)0x190;
                out._toYca = (ToYca *)operator_new__(960000);
                lVar12 = 0;
                for (lVar18 = 0; lVar18 != 300; lVar18 = lVar18 + 1) {
                  for (lVar20 = 0; lVar20 != 400; lVar20 = lVar20 + 1) {
                    half::half(&local_b4,-1.0);
                    half::half(&local_b6,-1.0);
                    half::half(&local_b8,-1.0);
                    half::half(&local_ba,-1.0);
                    *(ulong *)((long)(out._toYca)->_buf +
                              lVar20 * 8 + (long)out._outputFile * lVar12 + -0x60) =
                         CONCAT26(local_ba._h,
                                  CONCAT24(local_b8._h,CONCAT22(local_b6._h,local_b4._h)));
                  }
                  lVar12 = lVar12 + 8;
                }
                std::operator<<((ostream *)&std::cout,"reading one scan line at a time,");
                std::ostream::flush();
                _Var5 = fileName._M_dataplus;
                iVar10 = Imf_2_5::globalThreadCount();
                Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&header,_Var5._M_p,iVar10);
                pBVar14 = Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)&header);
                iVar10 = (pBVar14->min).x;
                if ((pBVar14->max).x - iVar10 != 399) {
                  __assert_fail("dw.max.x - dw.min.x + 1 == width",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                ,0x109,
                                "void (anonymous namespace)::writeReadIncomplete(const std::string &)"
                               );
                }
                iVar4 = (pBVar14->min).y;
                if ((pBVar14->max).y - iVar4 != 299) {
                  __assert_fail("dw.max.y - dw.min.y + 1 == height",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                ,0x10a,
                                "void (anonymous namespace)::writeReadIncomplete(const std::string &)"
                               );
                }
                if (iVar10 == 0) {
                  if (iVar4 != 0) {
                    __assert_fail("dw.min.y == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                  ,0x10c,
                                  "void (anonymous namespace)::writeReadIncomplete(const std::string &)"
                                 );
                  }
                  Imf_2_5::RgbaInputFile::setFrameBuffer
                            ((RgbaInputFile *)&header,(Rgba *)out._toYca,1,400);
                  for (uVar25 = 0; uVar25 != 300; uVar25 = uVar25 + 1) {
                    Imf_2_5::RgbaInputFile::readPixels((RgbaInputFile *)&header,uVar25);
                    if ((uVar25 == 0x19) || (uVar25 == 10)) {
                      __assert_fail("scanLineBroken",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                    ,0x123,
                                    "void (anonymous namespace)::writeReadIncomplete(const std::string &)"
                                   );
                    }
                    if (0x95 < uVar25) {
                      __assert_fail("scanLinePresent == (y < height / 2)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                    ,0x125,
                                    "void (anonymous namespace)::writeReadIncomplete(const std::string &)"
                                   );
                    }
                  }
                  poVar11 = std::operator<<((ostream *)&std::cout," comparing");
                  std::endl<char,std::char_traits<char>>(poVar11);
                  std::ostream::flush();
                  pcVar21 = ((out._toYca)->super_Mutex).super___mutex_base._M_mutex.__size + 6;
                  phVar16 = &(p1_1._data)->a;
                  for (uVar22 = 0; uVar22 != 300; uVar22 = uVar22 + 1) {
                    for (lVar12 = 0; lVar12 != 400; lVar12 = lVar12 + 1) {
                      if (((uVar22 < 0x96) && ((char)uVar22 != '\n')) &&
                         (((uint)uVar22 & 0xff) != 0x19)) {
                        fVar2 = *(float *)((long)&half::_toFloat +
                                          (ulong)*(ushort *)(pcVar21 + lVar12 * 8 + -6) * 4);
                        pfVar1 = (float *)((long)&half::_toFloat +
                                          (ulong)phVar16[lVar12 * 4 + -3]._h * 4);
                        if (((((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) ||
                             (fVar2 = *(float *)((long)&half::_toFloat +
                                                (ulong)*(ushort *)(pcVar21 + lVar12 * 8 + -4) * 4),
                             pfVar1 = (float *)((long)&half::_toFloat +
                                               (ulong)phVar16[lVar12 * 4 + -2]._h * 4),
                             fVar2 != *pfVar1)) ||
                            ((NAN(fVar2) || NAN(*pfVar1) ||
                             (fVar2 = *(float *)((long)&half::_toFloat +
                                                (ulong)*(ushort *)(pcVar21 + lVar12 * 8 + -2) * 4),
                             pfVar1 = (float *)((long)&half::_toFloat +
                                               (ulong)phVar16[lVar12 * 4 + -1]._h * 4),
                             fVar2 != *pfVar1)))) ||
                           ((NAN(fVar2) || NAN(*pfVar1) ||
                            ((fVar2 = *(float *)((long)&half::_toFloat +
                                                (ulong)*(ushort *)(pcVar21 + lVar12 * 8) * 4),
                             pfVar1 = (float *)((long)&half::_toFloat +
                                               (ulong)phVar16[lVar12 * 4]._h * 4), fVar2 != *pfVar1
                             || (NAN(fVar2) || NAN(*pfVar1))))))) {
                          __assert_fail("t.r == s.r && t.g == s.g && t.b == s.b && t.a == s.a",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                        ,0x136,
                                        "void (anonymous namespace)::writeReadIncomplete(const std::string &)"
                                       );
                        }
                      }
                      else {
                        fVar2 = *(float *)((long)&half::_toFloat +
                                          (ulong)*(ushort *)(pcVar21 + lVar12 * 8 + -6) * 4);
                        if (((((fVar2 != -1.0) || (NAN(fVar2))) ||
                             ((fVar2 = *(float *)((long)&half::_toFloat +
                                                 (ulong)*(ushort *)(pcVar21 + lVar12 * 8 + -4) * 4),
                              fVar2 != -1.0 ||
                              ((NAN(fVar2) ||
                               (fVar2 = *(float *)((long)&half::_toFloat +
                                                  (ulong)*(ushort *)(pcVar21 + lVar12 * 8 + -2) * 4)
                               , fVar2 != -1.0)))))) || (NAN(fVar2))) ||
                           ((fVar2 = *(float *)((long)&half::_toFloat +
                                               (ulong)*(ushort *)(pcVar21 + lVar12 * 8) * 4),
                            fVar2 != -1.0 || (NAN(fVar2))))) {
                          __assert_fail("t.r == -1 && t.g == -1 && t.b == -1 && t.a == -1",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                        ,0x13d,
                                        "void (anonymous namespace)::writeReadIncomplete(const std::string &)"
                                       );
                        }
                      }
                    }
                    pcVar21 = pcVar21 + (long)out._outputFile * 8;
                    phVar16 = phVar16 + p1_1._sizeY * 4;
                  }
                  Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&header);
                  Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D((Array2D<Imf_2_5::Rgba> *)&out);
                  out._vptr_RgbaOutputFile = (_func_int **)0x12c;
                  out._outputFile = (OutputFile *)0x190;
                  out._toYca = (ToYca *)operator_new__(960000);
                  lVar12 = 0;
                  for (lVar18 = 0; lVar18 != 300; lVar18 = lVar18 + 1) {
                    for (lVar20 = 0; lVar20 != 400; lVar20 = lVar20 + 1) {
                      half::half(&local_bc,-1.0);
                      half::half(&local_be,-1.0);
                      half::half(&local_c0,-1.0);
                      half::half(&local_c2,-1.0);
                      *(ulong *)((long)(out._toYca)->_buf +
                                lVar20 * 8 + (long)out._outputFile * lVar12 + -0x60) =
                           CONCAT26(local_c2._h,
                                    CONCAT24(local_c0._h,CONCAT22(local_be._h,local_bc._h)));
                    }
                    lVar12 = lVar12 + 8;
                  }
                  std::operator<<((ostream *)&std::cout,"reading multiple scan lines at a time,");
                  std::ostream::flush();
                  iVar10 = Imf_2_5::globalThreadCount();
                  Imf_2_5::RgbaInputFile::RgbaInputFile
                            ((RgbaInputFile *)&header,fileName._M_dataplus._M_p,iVar10);
                  pBVar14 = Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)&header);
                  iVar10 = (pBVar14->min).x;
                  if ((pBVar14->max).x - iVar10 == 399) {
                    iVar4 = (pBVar14->min).y;
                    if ((pBVar14->max).y - iVar4 != 299) {
                      __assert_fail("dw.max.y - dw.min.y + 1 == height",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                    ,0x150,
                                    "void (anonymous namespace)::writeReadIncomplete(const std::string &)"
                                   );
                    }
                    if (iVar10 == 0) {
                      if (iVar4 == 0) {
                        Imf_2_5::RgbaInputFile::setFrameBuffer
                                  ((RgbaInputFile *)&header,(Rgba *)out._toYca,1,400);
                        Imf_2_5::RgbaInputFile::readPixels((RgbaInputFile *)&header,0,299);
                        __assert_fail("scanLinesMissing || scanLinesBroken",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                      ,0x166,
                                      "void (anonymous namespace)::writeReadIncomplete(const std::string &)"
                                     );
                      }
                      __assert_fail("dw.min.y == 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                    ,0x152,
                                    "void (anonymous namespace)::writeReadIncomplete(const std::string &)"
                                   );
                    }
                    __assert_fail("dw.min.x == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                  ,0x151,
                                  "void (anonymous namespace)::writeReadIncomplete(const std::string &)"
                                 );
                  }
                  __assert_fail("dw.max.x - dw.min.x + 1 == width",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                ,0x14f,
                                "void (anonymous namespace)::writeReadIncomplete(const std::string &)"
                               );
                }
                __assert_fail("dw.min.x == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                              ,0x10b,
                              "void (anonymous namespace)::writeReadIncomplete(const std::string &)"
                             );
              }
              poVar11 = std::operator<<((ostream *)&std::cout,"\nreading multi-layer file");
              std::endl<char,std::char_traits<char>>(poVar11);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &out,local_b0,"imf_test_multi_layer_rgba.exr");
              p1_2._sizeX = 0x77;
              p1_2._sizeY = 0xed;
              p1_2._data = (half *)operator_new__(0xdc56);
              p2_2._sizeX = 0x77;
              p2_2._sizeY = 0xed;
              p2_2._data = (half *)operator_new__(0xdc56);
              lVar12 = 0;
              uVar22 = 0;
              while( true ) {
                uVar26 = (uVar22 & 0xffffffff) % 0x1d;
                uVar24 = (uVar22 & 0xffffffff) % 0x17;
                if (uVar22 == 0x77) break;
                uVar19 = 0;
                lVar18 = 0;
                local_a8 = uVar22;
                while( true ) {
                  if (lVar18 == 0x1da) break;
                  local_a0 = (double)CONCAT44(local_a0._4_4_,(int)uVar24);
                  half::half((half *)&header,(float)((int)uVar24 + (int)(uVar19 / 0x11) * -0x11));
                  *(undefined2 *)((long)&(p1_2._data)->_h + lVar18 + p1_2._sizeY * lVar12) =
                       header._map._M_t._M_impl._0_2_;
                  half::half((half *)&header,(float)((int)uVar26 + (int)(uVar19 / 0x13) * -0x13));
                  *(undefined2 *)((long)&(p2_2._data)->_h + lVar18 + p2_2._sizeY * lVar12) =
                       header._map._M_t._M_impl._0_2_;
                  lVar18 = lVar18 + 2;
                  uVar26 = (ulong)((int)uVar26 + 1);
                  uVar19 = (ulong)((int)uVar19 + 1);
                  uVar24 = (ulong)((int)local_a0._0_4_ + 1);
                }
                uVar22 = local_a8 + 1;
                lVar12 = lVar12 + 2;
              }
              fileName._M_dataplus._M_p = (pointer)0x0;
              Imf_2_5::Header::Header
                        (&header,0xed,0x77,1.0,(V2f *)&fileName,1.0,INCREASING_Y,ZIP_COMPRESSION);
              pCVar15 = Imf_2_5::Header::channels(&header);
              Imf_2_5::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
              Imf_2_5::ChannelList::insert(pCVar15,"R",(Channel *)&fileName);
              pCVar15 = Imf_2_5::Header::channels(&header);
              Imf_2_5::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
              Imf_2_5::ChannelList::insert(pCVar15,"foo.R",(Channel *)&fileName);
              p1_1._sizeY = (ulong)p1_1._sizeY._4_4_ << 0x20;
              p1_1._data = (Rgba *)0x0;
              Imf_2_5::Slice::Slice
                        ((Slice *)&fileName,HALF,(char *)p1_2._data,2,0x1da,1,1,0.0,SUB81(in_R10,0),
                         ytc);
              Imf_2_5::FrameBuffer::insert((FrameBuffer *)&p1_1,"R",(Slice *)&fileName);
              Imf_2_5::Slice::Slice
                        ((Slice *)&fileName,HALF,(char *)p2_2._data,2,0x1da,1,1,0.0,SUB81(in_R10,0),
                         ytc_00);
              Imf_2_5::FrameBuffer::insert((FrameBuffer *)&p1_1,"foo.R",(Slice *)&fileName);
              pp_Var6 = out._vptr_RgbaOutputFile;
              iVar10 = Imf_2_5::globalThreadCount();
              Imf_2_5::OutputFile::OutputFile
                        ((OutputFile *)&fileName,(char *)pp_Var6,&header,iVar10);
              Imf_2_5::OutputFile::setFrameBuffer((OutputFile *)&fileName,(FrameBuffer *)&p1_1);
              Imf_2_5::OutputFile::writePixels((OutputFile *)&fileName,0x77);
              Imf_2_5::OutputFile::~OutputFile((OutputFile *)&fileName);
              std::
              _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                           *)&p1_1);
              Imf_2_5::Header::~Header(&header);
              pp_Var6 = out._vptr_RgbaOutputFile;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fileName,"",(allocator<char> *)&p1_1);
              iVar10 = Imf_2_5::globalThreadCount();
              Imf_2_5::RgbaInputFile::RgbaInputFile
                        ((RgbaInputFile *)&header,(char *)pp_Var6,&fileName,iVar10);
              std::__cxx11::string::~string((string *)&fileName);
              fileName._M_dataplus._M_p = (pointer)0x77;
              fileName._M_string_length = 0xed;
              fileName.field_2._M_allocated_capacity = (size_type)operator_new__(0x37158);
              Imf_2_5::RgbaInputFile::setFrameBuffer
                        ((RgbaInputFile *)&header,(Rgba *)fileName.field_2._M_allocated_capacity,1,
                         0xed);
              Imf_2_5::RgbaInputFile::readPixels((RgbaInputFile *)&header,0,0x76);
              lVar12 = fileName.field_2._M_allocated_capacity + 6;
              lVar18 = 0;
              phVar16 = p1_2._data;
              do {
                if (lVar18 == 0x77) {
                  Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D((Array2D<Imf_2_5::Rgba> *)&fileName);
                  Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&header);
                  pp_Var6 = out._vptr_RgbaOutputFile;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&fileName,"foo",(allocator<char> *)&p1_1);
                  iVar10 = Imf_2_5::globalThreadCount();
                  Imf_2_5::RgbaInputFile::RgbaInputFile
                            ((RgbaInputFile *)&header,(char *)pp_Var6,&fileName,iVar10);
                  std::__cxx11::string::~string((string *)&fileName);
                  fileName._M_dataplus._M_p = (pointer)0x77;
                  fileName._M_string_length = 0xed;
                  fileName.field_2._M_allocated_capacity = (size_type)operator_new__(0x37158);
                  Imf_2_5::RgbaInputFile::setFrameBuffer
                            ((RgbaInputFile *)&header,(Rgba *)fileName.field_2._M_allocated_capacity
                             ,1,0xed);
                  Imf_2_5::RgbaInputFile::readPixels((RgbaInputFile *)&header,0,0x76);
                  lVar12 = fileName.field_2._M_allocated_capacity + 6;
                  lVar18 = 0;
                  phVar16 = p2_2._data;
                  do {
                    if (lVar18 == 0x77) {
                      Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D((Array2D<Imf_2_5::Rgba> *)&fileName)
                      ;
                      Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&header);
                      pp_Var6 = out._vptr_RgbaOutputFile;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&fileName,"",(allocator<char> *)&p1_1);
                      iVar10 = Imf_2_5::globalThreadCount();
                      Imf_2_5::RgbaInputFile::RgbaInputFile
                                ((RgbaInputFile *)&header,(char *)pp_Var6,&fileName,iVar10);
                      std::__cxx11::string::~string((string *)&fileName);
                      p1_1._sizeX = 0x77;
                      p1_1._sizeY = 0xed;
                      p1_1._data = (Rgba *)operator_new__(0x37158);
                      Imf_2_5::RgbaInputFile::setFrameBuffer
                                ((RgbaInputFile *)&header,p1_1._data,1,0xed);
                      Imf_2_5::RgbaInputFile::readPixels((RgbaInputFile *)&header,0,0x3a);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&fileName,"foo",(allocator<char> *)&local_18a);
                      Imf_2_5::RgbaInputFile::setLayerName((RgbaInputFile *)&header,&fileName);
                      std::__cxx11::string::~string((string *)&fileName);
                      Imf_2_5::RgbaInputFile::setFrameBuffer
                                ((RgbaInputFile *)&header,p1_1._data,1,0xed);
                      Imf_2_5::RgbaInputFile::readPixels((RgbaInputFile *)&header,0x3b,0x76);
                      phVar17 = &(p1_1._data)->a;
                      uVar22 = 0;
                      phVar16 = p2_2._data;
                      phVar23 = p1_2._data;
                      do {
                        xtc = (undefined1)in_R10;
                        if (uVar22 == 0x77) {
                          Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D(&p1_1);
                          Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&header);
                          fileName._M_dataplus._M_p = (pointer)0x0;
                          Imf_2_5::Header::Header
                                    (&header,0xed,0x77,1.0,(V2f *)&fileName,1.0,INCREASING_Y,
                                     ZIP_COMPRESSION);
                          pCVar15 = Imf_2_5::Header::channels(&header);
                          Imf_2_5::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
                          Imf_2_5::ChannelList::insert(pCVar15,"Y",(Channel *)&fileName);
                          pCVar15 = Imf_2_5::Header::channels(&header);
                          Imf_2_5::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
                          Imf_2_5::ChannelList::insert(pCVar15,"foo.Y",(Channel *)&fileName);
                          p1_1._sizeY = p1_1._sizeY & 0xffffffff00000000;
                          p1_1._data = (Rgba *)0x0;
                          Imf_2_5::Slice::Slice
                                    ((Slice *)&fileName,HALF,(char *)p1_2._data,2,0x1da,1,1,0.0,
                                     (bool)xtc,ytc_01);
                          Imf_2_5::FrameBuffer::insert((FrameBuffer *)&p1_1,"Y",(Slice *)&fileName);
                          Imf_2_5::Slice::Slice
                                    ((Slice *)&fileName,HALF,(char *)p2_2._data,2,0x1da,1,1,0.0,
                                     (bool)xtc,ytc_02);
                          Imf_2_5::FrameBuffer::insert
                                    ((FrameBuffer *)&p1_1,"foo.Y",(Slice *)&fileName);
                          pp_Var6 = out._vptr_RgbaOutputFile;
                          iVar10 = Imf_2_5::globalThreadCount();
                          Imf_2_5::OutputFile::OutputFile
                                    ((OutputFile *)&fileName,(char *)pp_Var6,&header,iVar10);
                          Imf_2_5::OutputFile::setFrameBuffer
                                    ((OutputFile *)&fileName,(FrameBuffer *)&p1_1);
                          Imf_2_5::OutputFile::writePixels((OutputFile *)&fileName,0x77);
                          Imf_2_5::OutputFile::~OutputFile((OutputFile *)&fileName);
                          std::
                          _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                          ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                                       *)&p1_1);
                          Imf_2_5::Header::~Header(&header);
                          pp_Var6 = out._vptr_RgbaOutputFile;
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&fileName,"",(allocator<char> *)&p1_1);
                          iVar10 = Imf_2_5::globalThreadCount();
                          Imf_2_5::RgbaInputFile::RgbaInputFile
                                    ((RgbaInputFile *)&header,(char *)pp_Var6,&fileName,iVar10);
                          std::__cxx11::string::~string((string *)&fileName);
                          fileName._M_dataplus._M_p = (pointer)0x77;
                          fileName._M_string_length = 0xed;
                          fileName.field_2._M_allocated_capacity =
                               (size_type)operator_new__(0x37158);
                          Imf_2_5::RgbaInputFile::setFrameBuffer
                                    ((RgbaInputFile *)&header,
                                     (Rgba *)fileName.field_2._M_allocated_capacity,1,0xed);
                          Imf_2_5::RgbaInputFile::readPixels((RgbaInputFile *)&header,0,0x76);
                          lVar12 = fileName.field_2._M_allocated_capacity + 6;
                          lVar18 = 0;
                          phVar16 = p1_2._data;
                          do {
                            if (lVar18 == 0x77) {
                              Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D
                                        ((Array2D<Imf_2_5::Rgba> *)&fileName);
                              Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&header);
                              pp_Var6 = out._vptr_RgbaOutputFile;
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&fileName,"foo",(allocator<char> *)&p1_1);
                              iVar10 = Imf_2_5::globalThreadCount();
                              Imf_2_5::RgbaInputFile::RgbaInputFile
                                        ((RgbaInputFile *)&header,(char *)pp_Var6,&fileName,iVar10);
                              std::__cxx11::string::~string((string *)&fileName);
                              fileName._M_dataplus._M_p = (pointer)0x77;
                              fileName._M_string_length = 0xed;
                              fileName.field_2._M_allocated_capacity =
                                   (size_type)operator_new__(0x37158);
                              Imf_2_5::RgbaInputFile::setFrameBuffer
                                        ((RgbaInputFile *)&header,
                                         (Rgba *)fileName.field_2._M_allocated_capacity,1,0xed);
                              Imf_2_5::RgbaInputFile::readPixels((RgbaInputFile *)&header,0,0x76);
                              lVar12 = fileName.field_2._M_allocated_capacity + 6;
                              lVar18 = 0;
                              phVar16 = p2_2._data;
                              do {
                                if (lVar18 == 0x77) {
                                  Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D
                                            ((Array2D<Imf_2_5::Rgba> *)&fileName);
                                  Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&header);
                                  pp_Var6 = out._vptr_RgbaOutputFile;
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&fileName,"",(allocator<char> *)&p1_1);
                                  iVar10 = Imf_2_5::globalThreadCount();
                                  Imf_2_5::RgbaInputFile::RgbaInputFile
                                            ((RgbaInputFile *)&header,(char *)pp_Var6,&fileName,
                                             iVar10);
                                  std::__cxx11::string::~string((string *)&fileName);
                                  p1_1._sizeX = 0x77;
                                  p1_1._sizeY = 0xed;
                                  p1_1._data = (Rgba *)operator_new__(0x37158);
                                  Imf_2_5::RgbaInputFile::setFrameBuffer
                                            ((RgbaInputFile *)&header,p1_1._data,1,0xed);
                                  Imf_2_5::RgbaInputFile::readPixels
                                            ((RgbaInputFile *)&header,0,0x3a);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&fileName,"foo",(allocator<char> *)&local_18a
                                            );
                                  Imf_2_5::RgbaInputFile::setLayerName
                                            ((RgbaInputFile *)&header,&fileName);
                                  std::__cxx11::string::~string((string *)&fileName);
                                  Imf_2_5::RgbaInputFile::setFrameBuffer
                                            ((RgbaInputFile *)&header,p1_1._data,1,0xed);
                                  Imf_2_5::RgbaInputFile::readPixels
                                            ((RgbaInputFile *)&header,0x3b,0x76);
                                  phVar17 = &(p1_1._data)->a;
                                  uVar22 = 0;
                                  phVar16 = p2_2._data;
                                  phVar23 = p1_2._data;
                                  do {
                                    if (uVar22 == 0x77) {
                                      Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D(&p1_1);
                                      Imf_2_5::RgbaInputFile::~RgbaInputFile
                                                ((RgbaInputFile *)&header);
                                      remove((char *)out._vptr_RgbaOutputFile);
                                      Imf_2_5::Array2D<half>::~Array2D(&p2_2);
                                      Imf_2_5::Array2D<half>::~Array2D(&p1_2);
                                      std::__cxx11::string::~string((string *)&out);
                                      poVar11 = std::operator<<((ostream *)&std::cout,"ok\n");
                                      std::endl<char,std::char_traits<char>>(poVar11);
                                      Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D(&p1);
                                      return;
                                    }
                                    lVar12 = 0;
                                    while (lVar12 != 0xed) {
                                      fVar2 = *(float *)((long)&half::_toFloat +
                                                        (ulong)phVar17[lVar12 * 4 + -3]._h * 4);
                                      if (uVar22 < 0x3b) {
                                        fVar3 = *(float *)((long)&half::_toFloat +
                                                          (ulong)phVar23[lVar12]._h * 4);
                                        if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                          __assert_fail("p3[y][x].r == p1[y][x]",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                                  ,0x23d,
                                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                                  );
                                        }
                                        fVar2 = *(float *)((long)&half::_toFloat +
                                                          (ulong)phVar17[lVar12 * 4 + -2]._h * 4);
                                        if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                          __assert_fail("p3[y][x].g == p1[y][x]",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                                  ,0x23e,
                                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                                  );
                                        }
                                        fVar2 = *(float *)((long)&half::_toFloat +
                                                          (ulong)phVar17[lVar12 * 4 + -1]._h * 4);
                                        if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                          __assert_fail("p3[y][x].b == p1[y][x]",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                                  ,0x23f,
                                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                                  );
                                        }
                                      }
                                      else {
                                        fVar3 = *(float *)((long)&half::_toFloat +
                                                          (ulong)phVar16[lVar12]._h * 4);
                                        if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                          __assert_fail("p3[y][x].r == p2[y][x]",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                                  ,0x243,
                                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                                  );
                                        }
                                        fVar2 = *(float *)((long)&half::_toFloat +
                                                          (ulong)phVar17[lVar12 * 4 + -2]._h * 4);
                                        if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                          __assert_fail("p3[y][x].g == p2[y][x]",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                                  ,0x244,
                                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                                  );
                                        }
                                        fVar2 = *(float *)((long)&half::_toFloat +
                                                          (ulong)phVar17[lVar12 * 4 + -1]._h * 4);
                                        if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                          __assert_fail("p3[y][x].b == p2[y][x]",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                                  ,0x245,
                                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                                  );
                                        }
                                      }
                                      fVar2 = *(float *)((long)&half::_toFloat +
                                                        (ulong)phVar17[lVar12 * 4]._h * 4);
                                      lVar12 = lVar12 + 1;
                                      if ((fVar2 != 1.0) || (NAN(fVar2))) {
                                        __assert_fail("p3[y][x].a == 1",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                                  ,0x248,
                                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                                  );
                                      }
                                    }
                                    uVar22 = uVar22 + 1;
                                    phVar17 = phVar17 + p1_1._sizeY * 4;
                                    phVar23 = phVar23 + p1_2._sizeY;
                                    phVar16 = phVar16 + p2_2._sizeY;
                                  } while( true );
                                }
                                lVar20 = 0;
                                while (lVar20 != 0xed) {
                                  fVar2 = *(float *)((long)&half::_toFloat +
                                                    (ulong)*(ushort *)(lVar12 + -6 + lVar20 * 8) * 4
                                                    );
                                  fVar3 = *(float *)((long)&half::_toFloat +
                                                    (ulong)phVar16[lVar20]._h * 4);
                                  if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                    __assert_fail("p3[y][x].r == p2[y][x]",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                                  ,0x222,
                                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                                 );
                                  }
                                  fVar2 = *(float *)((long)&half::_toFloat +
                                                    (ulong)*(ushort *)(lVar12 + -4 + lVar20 * 8) * 4
                                                    );
                                  if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                    __assert_fail("p3[y][x].g == p2[y][x]",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                                  ,0x223,
                                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                                 );
                                  }
                                  fVar2 = *(float *)((long)&half::_toFloat +
                                                    (ulong)*(ushort *)(lVar12 + -2 + lVar20 * 8) * 4
                                                    );
                                  if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                    __assert_fail("p3[y][x].b == p2[y][x]",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                                  ,0x224,
                                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                                 );
                                  }
                                  fVar2 = *(float *)((long)&half::_toFloat +
                                                    (ulong)*(ushort *)(lVar12 + lVar20 * 8) * 4);
                                  lVar20 = lVar20 + 1;
                                  if ((fVar2 != 1.0) || (NAN(fVar2))) {
                                    __assert_fail("p3[y][x].a == 1",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                                  ,0x225,
                                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                                 );
                                  }
                                }
                                lVar18 = lVar18 + 1;
                                lVar12 = lVar12 + fileName._M_string_length * 8;
                                phVar16 = phVar16 + p2_2._sizeY;
                              } while( true );
                            }
                            lVar20 = 0;
                            while (lVar20 != 0xed) {
                              fVar2 = *(float *)((long)&half::_toFloat +
                                                (ulong)*(ushort *)(lVar12 + -6 + lVar20 * 8) * 4);
                              fVar3 = *(float *)((long)&half::_toFloat +
                                                (ulong)phVar16[lVar20]._h * 4);
                              if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                __assert_fail("p3[y][x].r == p1[y][x]",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                              ,0x20f,
                                              "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                             );
                              }
                              fVar2 = *(float *)((long)&half::_toFloat +
                                                (ulong)*(ushort *)(lVar12 + -4 + lVar20 * 8) * 4);
                              if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                __assert_fail("p3[y][x].g == p1[y][x]",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                              ,0x210,
                                              "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                             );
                              }
                              fVar2 = *(float *)((long)&half::_toFloat +
                                                (ulong)*(ushort *)(lVar12 + -2 + lVar20 * 8) * 4);
                              if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                __assert_fail("p3[y][x].b == p1[y][x]",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                              ,0x211,
                                              "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                             );
                              }
                              fVar2 = *(float *)((long)&half::_toFloat +
                                                (ulong)*(ushort *)(lVar12 + lVar20 * 8) * 4);
                              lVar20 = lVar20 + 1;
                              if ((fVar2 != 1.0) || (NAN(fVar2))) {
                                __assert_fail("p3[y][x].a == 1",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                              ,0x212,
                                              "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                             );
                              }
                            }
                            lVar18 = lVar18 + 1;
                            lVar12 = lVar12 + fileName._M_string_length * 8;
                            phVar16 = phVar16 + p1_2._sizeY;
                          } while( true );
                        }
                        lVar12 = 0;
                        while (lVar12 != 0xed) {
                          fVar2 = *(float *)((long)&half::_toFloat +
                                            (ulong)phVar17[lVar12 * 4 + -3]._h * 4);
                          if (uVar22 < 0x3b) {
                            pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar23[lVar12]._h * 4
                                              );
                            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                              __assert_fail("p3[y][x].r == p1[y][x]",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                            ,0x1e1,
                                            "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                           );
                            }
                          }
                          else {
                            pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar16[lVar12]._h * 4
                                              );
                            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                              __assert_fail("p3[y][x].r == p2[y][x]",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                            ,0x1e3,
                                            "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                           );
                            }
                          }
                          fVar2 = *(float *)((long)&half::_toFloat +
                                            (ulong)phVar17[lVar12 * 4 + -2]._h * 4);
                          if ((fVar2 != 0.0) || (NAN(fVar2))) {
                            __assert_fail("p3[y][x].g == 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                          ,0x1e5,
                                          "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                         );
                          }
                          fVar2 = *(float *)((long)&half::_toFloat +
                                            (ulong)phVar17[lVar12 * 4 + -1]._h * 4);
                          if ((fVar2 != 0.0) || (NAN(fVar2))) {
                            __assert_fail("p3[y][x].b == 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                          ,0x1e6,
                                          "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                         );
                          }
                          fVar2 = *(float *)((long)&half::_toFloat +
                                            (ulong)phVar17[lVar12 * 4]._h * 4);
                          lVar12 = lVar12 + 1;
                          if ((fVar2 != 1.0) || (NAN(fVar2))) {
                            __assert_fail("p3[y][x].a == 1",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                          ,0x1e7,
                                          "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                         );
                          }
                        }
                        uVar22 = uVar22 + 1;
                        phVar23 = phVar23 + p1_2._sizeY;
                        phVar17 = phVar17 + p1_1._sizeY * 4;
                        phVar16 = phVar16 + p2_2._sizeY;
                        in_R10 = 0xed;
                      } while( true );
                    }
                    lVar20 = 0;
                    while (lVar20 != 0xed) {
                      fVar2 = *(float *)((long)&half::_toFloat +
                                        (ulong)*(ushort *)(lVar12 + -6 + lVar20 * 8) * 4);
                      pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar16[lVar20]._h * 4);
                      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                        __assert_fail("p3[y][x].r == p2[y][x]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                      ,0x1c7,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                     );
                      }
                      fVar2 = *(float *)((long)&half::_toFloat +
                                        (ulong)*(ushort *)(lVar12 + -4 + lVar20 * 8) * 4);
                      if ((fVar2 != 0.0) || (NAN(fVar2))) {
                        __assert_fail("p3[y][x].g == 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                      ,0x1c8,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                     );
                      }
                      fVar2 = *(float *)((long)&half::_toFloat +
                                        (ulong)*(ushort *)(lVar12 + -2 + lVar20 * 8) * 4);
                      if ((fVar2 != 0.0) || (NAN(fVar2))) {
                        __assert_fail("p3[y][x].b == 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                      ,0x1c9,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                     );
                      }
                      fVar2 = *(float *)((long)&half::_toFloat +
                                        (ulong)*(ushort *)(lVar12 + lVar20 * 8) * 4);
                      lVar20 = lVar20 + 1;
                      if ((fVar2 != 1.0) || (NAN(fVar2))) {
                        __assert_fail("p3[y][x].a == 1",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                      ,0x1ca,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                     );
                      }
                    }
                    lVar18 = lVar18 + 1;
                    lVar12 = lVar12 + fileName._M_string_length * 8;
                    phVar16 = phVar16 + p2_2._sizeY;
                  } while( true );
                }
                lVar20 = 0;
                while (lVar20 != 0xed) {
                  fVar2 = *(float *)((long)&half::_toFloat +
                                    (ulong)*(ushort *)(lVar12 + -6 + lVar20 * 8) * 4);
                  pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar16[lVar20]._h * 4);
                  if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                    __assert_fail("p3[y][x].r == p1[y][x]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                  ,0x1b4,
                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                 );
                  }
                  fVar2 = *(float *)((long)&half::_toFloat +
                                    (ulong)*(ushort *)(lVar12 + -4 + lVar20 * 8) * 4);
                  if ((fVar2 != 0.0) || (NAN(fVar2))) {
                    __assert_fail("p3[y][x].g == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                  ,0x1b5,
                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                 );
                  }
                  fVar2 = *(float *)((long)&half::_toFloat +
                                    (ulong)*(ushort *)(lVar12 + -2 + lVar20 * 8) * 4);
                  if ((fVar2 != 0.0) || (NAN(fVar2))) {
                    __assert_fail("p3[y][x].b == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                  ,0x1b6,
                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                 );
                  }
                  fVar2 = *(float *)((long)&half::_toFloat +
                                    (ulong)*(ushort *)(lVar12 + lVar20 * 8) * 4);
                  lVar20 = lVar20 + 1;
                  if ((fVar2 != 1.0) || (NAN(fVar2))) {
                    __assert_fail("p3[y][x].a == 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                                  ,0x1b7,
                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                 );
                  }
                }
                lVar18 = lVar18 + 1;
                lVar12 = lVar12 + fileName._M_string_length * 8;
                phVar16 = phVar16 + p1_2._sizeY;
              } while( true );
            }
            pcVar21 = "z.r == 2.f && z.g == 3.f && z.b == 4.f && z.a == 1.f";
            uVar25 = 0x4f;
          }
          goto LAB_00173c01;
        }
      }
    }
  }
  pcVar21 = "x.r == 2.f && x.g == 3.f && x.b == 4.f && x.a == 1.f";
  uVar25 = 0x47;
LAB_00173c01:
  __assert_fail(pcVar21,
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgba.cpp"
                ,uVar25,"void (anonymous namespace)::rgbaMethods()");
}

Assistant:

void
testRgba (const std::string &tempDir)
{
    try
    {
	cout << "Testing the RGBA image interface" << endl;

	rgbaMethods ();

	const int W = 237;
	const int H = 119;

	Array2D<Rgba> p1 (H, W);
	fillPixels (p1, W, H);

	int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads()? 3: 0;

	for (int n = 0; n <= maxThreads; ++n)
	{
	    if (ILMTHREAD_NAMESPACE::supportsThreads())
	    {
		setGlobalThreadCount (n);
		cout << "\nnumber of threads: " << globalThreadCount() << endl;
	    }

	    for (int lorder = 0; lorder < RANDOM_Y; ++lorder)
	    {
		for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
		{
		    writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
				   W, H, p1,
				   WRITE_RGBA,
				   LineOrder (lorder),
				   Compression (comp));

		    writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
				   W, H, p1,
				   WRITE_RGB,
				   LineOrder (lorder),
				   Compression (comp));

		    writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
				   W, H, p1,
				   WRITE_A,
				   LineOrder (lorder),
				   Compression (comp));

		    writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
				   W, H, p1,
				   RgbaChannels (WRITE_R | WRITE_B),
				   LineOrder (lorder),
				   Compression (comp));
		}
	    }

	    writeReadIncomplete (tempDir);
	}

	writeReadLayers (tempDir);

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}